

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O2

string * testing::internal::JoinAsKeyValueTuple
                   (string *__return_storage_ptr__,
                   vector<const_char_*,_std::allocator<const_char_*>_> *names,Strings *values)

{
  bool bVar1;
  ulong i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  anon_class_16_2_1175fbd1 build_one;
  
  bVar1 = IsTrue(*(long *)(names + 8) - *(long *)names >> 3 ==
                 (long)(values->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(values->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)&local_60,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/build_O2/googletest-src/googlemock/src/gmock-internal-utils.cc"
                       ,0x3d);
    std::operator<<((ostream *)&std::cerr,"Condition names.size() == values.size() failed. ");
    GTestLog::~GTestLog((GTestLog *)&local_60);
  }
  if ((values->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (values->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_60);
  }
  else {
    build_one.names = names;
    build_one.values = values;
    JoinAsKeyValueTuple(std::vector<char_const*,std::allocator<char_const*>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
    ::$_0::operator()[abi_cxx11_(&local_60,&build_one,0);
    std::operator+(__return_storage_ptr__,"(",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    for (i = 1; i < (ulong)((long)(values->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(values->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5); i = i + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      JoinAsKeyValueTuple(std::vector<char_const*,std::allocator<char_const*>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::$_0::operator()[abi_cxx11_(&local_60,&build_one,i);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ std::string JoinAsKeyValueTuple(
    const std::vector<const char*>& names, const Strings& values) {
  GTEST_CHECK_(names.size() == values.size());
  if (values.empty()) {
    return "";
  }
  const auto build_one = [&](const size_t i) {
    return std::string(names[i]) + ": " + values[i];
  };
  std::string result = "(" + build_one(0);
  for (size_t i = 1; i < values.size(); i++) {
    result += ", ";
    result += build_one(i);
  }
  result += ")";
  return result;
}